

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_number.hpp
# Opt level: O2

type_conflict2 __thiscall
jsoncons::detail::from_integer<__int128,std::__cxx11::string>
          (detail *this,__int128 value,
          basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *result)

{
  undefined1 auVar1 [16];
  assertion_error *this_00;
  char in_DL;
  char_type *pcVar2;
  long lVar3;
  type_conflict2 tVar4;
  ulong uVar5;
  ulong uVar6;
  type_conflict2 tVar7;
  undefined1 auVar8 [16];
  allocator<char> local_161;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_160;
  string local_158;
  char_type buf [255];
  
  auVar1._8_8_ = result;
  auVar1._0_8_ = this;
  local_160 = result;
  if ((long)result < 0) {
    uVar5 = 0;
    do {
      uVar6 = auVar1._0_8_;
      auVar8 = __divti3(uVar6,auVar1._8_8_,10,0);
      tVar4 = uVar5 + 1;
      buf[uVar5] = '0' - (auVar1[0] + auVar8[0] * -10);
      lVar3 = auVar1._8_8_ + ((ulong)(9 < uVar6) - 1);
      if (0xfd < uVar5) break;
      uVar5 = tVar4;
      auVar1 = auVar8;
    } while (lVar3 != -1 || lVar3 + 1U < (ulong)((undefined1 *)(uVar6 - 10) < &DAT_ffffffffffffffed)
            );
  }
  else {
    uVar5 = 0;
    do {
      lVar3 = auVar1._8_8_;
      uVar6 = auVar1._0_8_;
      auVar8 = __udivti3(uVar6,lVar3,10,0);
      tVar4 = uVar5 + 1;
      buf[uVar5] = auVar1[0] + auVar8[0] * -10 | 0x30;
      if (0xfd < uVar5) break;
      uVar5 = tVar4;
      auVar1 = auVar8;
    } while (lVar3 != 0 || (ulong)-lVar3 < (ulong)(9 < uVar6));
  }
  if (tVar4 == 0xff) {
    this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_158,"assertion \'p != last\' failed at  <> :0",&local_161);
    assertion_error::assertion_error(this_00,&local_158);
    __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
  }
  tVar7 = tVar4;
  if ((long)local_160 < 0) {
    std::__cxx11::string::push_back(in_DL);
    tVar7 = tVar4 + 1;
  }
  pcVar2 = buf + tVar4;
  while (pcVar2 = pcVar2 + -1, buf <= pcVar2) {
    std::__cxx11::string::push_back(in_DL);
  }
  return tVar7;
}

Assistant:

typename std::enable_if<ext_traits::is_integer<Integer>::value,std::size_t>::type
    from_integer(Integer value, Result& result)
    {
        using char_type = typename Result::value_type;

        char_type buf[255];
        char_type *p = buf;
        const char_type* last = buf+255;

        bool is_negative = value < 0;

        if (value < 0)
        {
            do
            {
                *p++ = static_cast<char_type>(48 - (value % 10));
            }
            while ((value /= 10) && (p < last));
        }
        else
        {

            do
            {
                *p++ = static_cast<char_type>(48 + value % 10);
            }
            while ((value /= 10) && (p < last));
        }
        JSONCONS_ASSERT(p != last);

        std::size_t count = (p - buf);
        if (is_negative)
        {
            result.push_back('-');
            ++count;
        }
        while (--p >= buf)
        {
            result.push_back(*p);
        }

        return count;
    }